

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int is_door_locked(tgestate_t *state)

{
  tgestate_t *in_RDI;
  uint8_t iters;
  doorindex_t *door;
  doorindex_t cur;
  char local_21;
  doorindex_t *local_20;
  
  local_20 = in_RDI->locked_doors;
  local_21 = '\v';
  do {
    if ((*local_20 & 0x7f) == (in_RDI->current_door & 0x7f)) {
      if ((*local_20 & 0x80) == 0) {
        return 0;
      }
      queue_message(in_RDI,message_THE_DOOR_IS_LOCKED);
      return 1;
    }
    local_20 = local_20 + 1;
    local_21 = local_21 + -1;
  } while (local_21 != '\0');
  return 0;
}

Assistant:

int is_door_locked(tgestate_t *state)
{
  doorindex_t  cur;   /* was C */
  doorindex_t *door;  /* was HL */
  uint8_t      iters; /* was B */

  assert(state != NULL);

  cur   = state->current_door & ~door_REVERSE;
  door  = &state->locked_doors[0];
  iters = NELEMS(state->locked_doors);
  do
  {
    if ((*door & ~door_LOCKED) == cur)
    {
      if ((*door & door_LOCKED) == 0)
        return 0; /* Door is open. */

      queue_message(state, message_THE_DOOR_IS_LOCKED);
      return 1; /* Door is locked. */
    }
    door++;
  }
  while (--iters);

  return 0; /* Door is open. */
}